

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operand.cpp
# Opt level: O3

spv_result_t
spvOperandTableNameLookup
          (spv_target_env param_1,spv_operand_table table,spv_operand_type_t type,char *name,
          size_t nameLength,spv_operand_desc *pEntry)

{
  spv_operand_desc_t *psVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  spv_operand_desc_group_t *psVar5;
  spv_operand_desc_t *psVar6;
  char *pcVar7;
  char **ppcVar8;
  spv_result_t sVar9;
  int iVar10;
  size_t sVar11;
  ulong uVar12;
  ulong uVar13;
  uint32_t aliasIndex;
  ulong uVar14;
  
  if (table == (spv_operand_table)0x0) {
    return SPV_ERROR_INVALID_TABLE;
  }
  sVar9 = SPV_ERROR_INVALID_POINTER;
  if (pEntry != (spv_operand_desc *)0x0 && name != (char *)0x0) {
    uVar2 = table->count;
    sVar9 = SPV_ERROR_INVALID_LOOKUP;
    if ((ulong)uVar2 != 0) {
      psVar5 = table->types;
      uVar12 = 0;
      do {
        if (psVar5[uVar12].type == type) {
          uVar3 = psVar5[uVar12].count;
          if ((ulong)uVar3 != 0) {
            psVar6 = psVar5[uVar12].entries;
            uVar13 = 0;
            do {
              psVar1 = psVar6 + uVar13;
              pcVar7 = psVar6[uVar13].name;
              sVar11 = strlen(pcVar7);
              if ((sVar11 == nameLength) && (iVar10 = strncmp(pcVar7,name,nameLength), iVar10 == 0))
              {
LAB_00620ba1:
                *pEntry = psVar1;
                return SPV_SUCCESS;
              }
              uVar4 = psVar1->numAliases;
              if ((ulong)uVar4 != 0) {
                ppcVar8 = psVar1->aliases;
                uVar14 = 0;
                do {
                  pcVar7 = ppcVar8[uVar14];
                  sVar11 = strlen(pcVar7);
                  if ((sVar11 == nameLength) &&
                     (iVar10 = strncmp(name,pcVar7,nameLength), iVar10 == 0)) goto LAB_00620ba1;
                  uVar14 = uVar14 + 1;
                } while (uVar4 != uVar14);
              }
              uVar13 = uVar13 + 1;
            } while (uVar13 != uVar3);
          }
        }
        uVar12 = uVar12 + 1;
      } while (uVar12 != uVar2);
      sVar9 = SPV_ERROR_INVALID_LOOKUP;
    }
  }
  return sVar9;
}

Assistant:

spv_result_t spvOperandTableNameLookup(spv_target_env,
                                       const spv_operand_table table,
                                       const spv_operand_type_t type,
                                       const char* name,
                                       const size_t nameLength,
                                       spv_operand_desc* pEntry) {
  if (!table) return SPV_ERROR_INVALID_TABLE;
  if (!name || !pEntry) return SPV_ERROR_INVALID_POINTER;

  for (uint64_t typeIndex = 0; typeIndex < table->count; ++typeIndex) {
    const auto& group = table->types[typeIndex];
    if (type != group.type) continue;
    for (uint64_t index = 0; index < group.count; ++index) {
      const auto& entry = group.entries[index];
      // We consider the current operand as available as long as
      // it is in the grammar.  It might not be *valid* to use,
      // but that should be checked by the validator, not by parsing.
      //
      // Exact match case
      if (nameLength == strlen(entry.name) &&
          !strncmp(entry.name, name, nameLength)) {
        *pEntry = &entry;
        return SPV_SUCCESS;
      }

      // Check the aliases. Ideally we would have a version of the table sorted
      // by name and then we could iterate between the lower and upper bounds to
      // restrict the amount comparisons. Fortunately, name-based lookups are
      // mostly restricted to the assembler.
      if (entry.numAliases > 0) {
        for (uint32_t aliasIndex = 0; aliasIndex < entry.numAliases;
             aliasIndex++) {
          const auto alias = entry.aliases[aliasIndex];
          const size_t aliasLength = strlen(alias);
          if (nameLength == aliasLength && !strncmp(name, alias, nameLength)) {
            *pEntry = &entry;
            return SPV_SUCCESS;
          }
        }
      }
    }
  }

  return SPV_ERROR_INVALID_LOOKUP;
}